

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O3

double sptk::world::anon_unknown_1::SelectBestF0
                 (double current_f0,double past_f0,double **f0_candidates,int number_of_candidates,
                 int target_index,double allowed_range)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = (current_f0 * 3.0 - past_f0) * 0.5;
  dVar3 = (*f0_candidates)[target_index];
  if (1 < number_of_candidates) {
    uVar1 = 1;
    dVar5 = ABS(dVar2 - dVar3);
    do {
      dVar4 = ABS(dVar2 - f0_candidates[uVar1][target_index]);
      dVar6 = dVar4;
      if (dVar5 <= dVar4) {
        dVar6 = dVar5;
      }
      dVar3 = (double)(~-(ulong)(dVar4 < dVar5) & (ulong)dVar3 |
                      (ulong)f0_candidates[uVar1][target_index] & -(ulong)(dVar4 < dVar5));
      uVar1 = uVar1 + 1;
      dVar5 = dVar6;
    } while ((uint)number_of_candidates != uVar1);
  }
  return (double)(~-(ulong)(allowed_range < ABS(1.0 - dVar3 / dVar2)) & (ulong)dVar3);
}

Assistant:

static double SelectBestF0(double current_f0, double past_f0,
    const double * const * f0_candidates, int number_of_candidates,
    int target_index, double allowed_range) {
  double reference_f0 = (current_f0 * 3.0 - past_f0) / 2.0;

  double minimum_error = fabs(reference_f0 - f0_candidates[0][target_index]);
  double best_f0 = f0_candidates[0][target_index];

  double current_error;
  for (int i = 1; i < number_of_candidates; ++i) {
    current_error = fabs(reference_f0 - f0_candidates[i][target_index]);
    if (current_error < minimum_error) {
      minimum_error = current_error;
      best_f0 = f0_candidates[i][target_index];
    }
  }
  if (fabs(1.0 - best_f0 / reference_f0) > allowed_range)
    return 0.0;
  return best_f0;
}